

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
TempTracker<ObjectTemp>::MergeData
          (TempTracker<ObjectTemp> *this,TempTracker<ObjectTemp> *fromData,bool deleteData)

{
  JitArenaAllocator *allocator;
  bool deleteData_local;
  TempTracker<ObjectTemp> *fromData_local;
  TempTracker<ObjectTemp> *this_local;
  
  TempTrackerBase::MergeData((TempTrackerBase *)this,(TempTrackerBase *)fromData,deleteData);
  TempTrackerBase::MergeData((TempTrackerBase *)this,(TempTrackerBase *)fromData,deleteData);
  if (deleteData) {
    allocator = TempTrackerBase::GetAllocator((TempTrackerBase *)this);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,TempTracker<ObjectTemp>>
              (allocator,fromData);
  }
  return;
}

Assistant:

void
TempTracker<T>::MergeData(TempTracker<T> * fromData, bool deleteData)
{
    TempTrackerBase::MergeData(fromData, deleteData);
    T::MergeData(fromData, deleteData);

    if (deleteData)
    {
        JitAdelete(this->GetAllocator(), fromData);
    }
}